

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * BiCGIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                 double OmegaPrecond)

{
  double bNorm;
  double dVar1;
  Boolean BVar2;
  LASErrIdType LVar3;
  size_t Dim;
  Vector *pVVar4;
  QMatrix *pQVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double local_1d8;
  Vector r_;
  Vector z_;
  Vector p;
  Vector r;
  Vector z;
  Vector q;
  Vector p_;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&r,"r",Dim,Normal,True);
  V_Constr(&r_,"r_",Dim,Normal,True);
  V_Constr(&p,"p",Dim,Normal,True);
  V_Constr(&p_,"p_",Dim,Normal,True);
  V_Constr(&q,"q",Dim,Normal,True);
  if (PrecondProc == (PrecondProcType)0x0) {
    BVar2 = Q_KerDefined(A);
    if (BVar2 != False) goto LAB_001078c6;
  }
  else {
LAB_001078c6:
    V_Constr(&z,"z",Dim,Normal,True);
    V_Constr(&z_,"z_",Dim,Normal,True);
  }
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar1 = l1Norm_V(x);
    auVar8._8_4_ = (int)(Dim >> 0x20);
    auVar8._0_8_ = Dim;
    auVar8._12_4_ = 0x45300000;
    pVVar4 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar1 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar4 = Mul_QV(A,x);
      pVVar4 = Sub_VV(b,pVVar4);
    }
    Asgn_VV(&r,pVVar4);
    if (PrecondProc == (PrecondProcType)0x0) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 == False) {
        Asgn_VV(&r_,&r);
        iVar6 = 0;
        local_1d8 = 0.0;
        while( true ) {
          dVar1 = l2Norm_V(&r);
          BVar2 = RTCResult(iVar6,dVar1,bNorm,BiCGIterId);
          if ((BVar2 != False) || (MaxIter <= iVar6)) break;
          dVar1 = Mul_VV(&r,&r_);
          if (ABS(dVar1) < 2.2250738585072014e-307) goto LAB_00107dd2;
          if (iVar6 == 0) {
            Asgn_VV(&p,&r);
            pVVar4 = &r_;
          }
          else {
            pVVar4 = Mul_SV(dVar1 / local_1d8,&p);
            pVVar4 = Add_VV(&r,pVVar4);
            Asgn_VV(&p,pVVar4);
            pVVar4 = Mul_SV(dVar1 / local_1d8,&p_);
            pVVar4 = Add_VV(&r_,pVVar4);
          }
          Asgn_VV(&p_,pVVar4);
          pVVar4 = Mul_QV(A,&p);
          Asgn_VV(&q,pVVar4);
          dVar7 = Mul_VV(&p_,&q);
          dVar7 = dVar1 / dVar7;
          pVVar4 = Mul_SV(dVar7,&p);
          AddAsgn_VV(x,pVVar4);
          pVVar4 = Mul_SV(dVar7,&q);
          SubAsgn_VV(&r,pVVar4);
          pQVar5 = Transp_Q(A);
          pVVar4 = Mul_QV(pQVar5,&p_);
          pVVar4 = Mul_SV(dVar7,pVVar4);
          SubAsgn_VV(&r_,pVVar4);
          iVar6 = iVar6 + 1;
          local_1d8 = dVar1;
        }
        goto LAB_00107ded;
      }
    }
    Asgn_VV(&r_,&r);
    iVar6 = 0;
    local_1d8 = 0.0;
    while( true ) {
      dVar1 = l2Norm_V(&r);
      BVar2 = RTCResult(iVar6,dVar1,bNorm,BiCGIterId);
      if ((BVar2 != False) || (MaxIter <= iVar6)) break;
      if (PrecondProc == (PrecondProcType)0x0) {
        Asgn_VV(&z,&r);
      }
      else {
        (*PrecondProc)(A,&z,&r,OmegaPrecond);
      }
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(&z,A);
      }
      if (PrecondProc == (PrecondProcType)0x0) {
        Asgn_VV(&z_,&r_);
      }
      else {
        pQVar5 = Transp_Q(A);
        (*PrecondProc)(pQVar5,&z_,&r_,OmegaPrecond);
      }
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        pQVar5 = Transp_Q(A);
        OrthoRightKer_VQ(&z_,pQVar5);
      }
      dVar1 = Mul_VV(&z,&r_);
      if (ABS(dVar1) < 2.2250738585072014e-307) goto LAB_00107dd2;
      if (iVar6 == 0) {
        Asgn_VV(&p,&z);
        pVVar4 = &z_;
      }
      else {
        pVVar4 = Mul_SV(dVar1 / local_1d8,&p);
        pVVar4 = Add_VV(&z,pVVar4);
        Asgn_VV(&p,pVVar4);
        pVVar4 = Mul_SV(dVar1 / local_1d8,&p_);
        pVVar4 = Add_VV(&z_,pVVar4);
      }
      Asgn_VV(&p_,pVVar4);
      pVVar4 = Mul_QV(A,&p);
      Asgn_VV(&q,pVVar4);
      dVar7 = Mul_VV(&p_,&q);
      dVar7 = dVar1 / dVar7;
      pVVar4 = Mul_SV(dVar7,&p);
      AddAsgn_VV(x,pVVar4);
      pVVar4 = Mul_SV(dVar7,&q);
      SubAsgn_VV(&r,pVVar4);
      pQVar5 = Transp_Q(A);
      pVVar4 = Mul_QV(pQVar5,&p_);
      pVVar4 = Mul_SV(dVar7,pVVar4);
      SubAsgn_VV(&r_,pVVar4);
      iVar6 = iVar6 + 1;
      local_1d8 = dVar1;
    }
    goto LAB_00107ded;
  }
  goto LAB_00107e0e;
LAB_00107dd2:
  LASError(LASBreakdownErr,"BiCGIter","Rho",(char *)0x0,(char *)0x0);
LAB_00107ded:
  BVar2 = Q_KerDefined(A);
  if (BVar2 != False) {
    OrthoRightKer_VQ(x,A);
  }
LAB_00107e0e:
  V_Destr(&r);
  V_Destr(&r_);
  V_Destr(&p);
  V_Destr(&p_);
  V_Destr(&q);
  if (PrecondProc == (PrecondProcType)0x0) {
    BVar2 = Q_KerDefined(A);
    if (BVar2 == False) goto LAB_00107e7a;
  }
  V_Destr(&z);
  V_Destr(&z_);
LAB_00107e7a:
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *BiCGIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, q, z, z_;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&p_, "p_", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Constr(&z, "z", Dim, Normal, True);
        V_Constr(&z_, "z_", Dim, Normal, True);
    }

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned BiCG */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
		if (PrecondProc != NULL)
                    (*PrecondProc)(Transp_Q(A), &z_, &r_, OmegaPrecond);
		else
		    Asgn_VV(&z_, &r_);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z_, Transp_Q(A));
                Rho = Mul_VV(&z, &r_);
                if (IsZero(Rho)){
                    LASError(LASBreakdownErr, "BiCGIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                    Asgn_VV(&p_, &z_);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                    Asgn_VV(&p_, Add_VV(&z_, Mul_SV(Beta, &p_)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p_, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                SubAsgn_VV(&r_, Mul_SV(Alpha, Mul_QV(Transp_Q(A), &p_)));
                RhoOld = Rho;
            }
        } else {
            /* plain BiCG (z = r, z_ = r_) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r, &r_);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "BiCGIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                    Asgn_VV(&p_, &r_);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, &p)));
                    Asgn_VV(&p_, Add_VV(&r_, Mul_SV(Beta, &p_)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p_, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                SubAsgn_VV(&r_, Mul_SV(Alpha, Mul_QV(Transp_Q(A), &p_)));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&p_);
    V_Destr(&q);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Destr(&z);
        V_Destr(&z_);
    }

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}